

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

t_pvalue __thiscall
xemmai::t_derived_primitive<double>::f_do_construct
          (t_derived_primitive<double> *this,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar2;
  t_type local_20;
  
  f_check<double>(*(t_object **)(a_n + 0x20),L"argument0");
  local_20 = t_type_of<double>::t_cast<double>::f_as<xemmai::t_value<xemmai::t_pointer>&>
                       ((t_value<xemmai::t_pointer> *)(a_n + 0x20));
  ptVar1 = t_type_of<xemmai::t_object>::f_new<double,double>
                     ((t_type_of<xemmai::t_object> *)a_stack,&local_20);
  (this->super_t_derived<xemmai::t_type_of<double>_>).super_t_type_of<double>.
  super_t_derivable<xemmai::t_bears<double,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<double>_>
  .super_t_bears<double,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<double,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
  v_this = (t_slot)ptVar1;
  tVar2.field_0.v_integer = extraout_RDX.v_integer;
  tVar2.super_t_pointer.v_p = (t_object *)this;
  return tVar2;
}

Assistant:

t_pvalue f_do_construct(t_pvalue* a_stack, size_t a_n)
	{
		f_check<T>(a_stack[2], L"argument0");
		return this->template f_new<T>(f_as<T>(a_stack[2]));
	}